

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O3

HalfRange ktx::parseHalfRange(string_view key,string_view str)

{
  int iVar1;
  void *pvVar2;
  char **ppcVar3;
  int *piVar4;
  ulong uVar5;
  long *plVar6;
  invalid_argument *this;
  char *__s;
  char **__nptr;
  size_type __n;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  int *piVar10;
  string_view fmt;
  format_args args;
  undefined1 auVar11 [12];
  char **local_a8;
  size_t local_a0;
  char *local_98;
  char **local_90;
  undefined8 local_88;
  char **local_70;
  size_t local_68;
  char *local_60;
  char **local_58;
  string local_50;
  
  __s = str._M_str;
  __nptr = (char **)str._M_len;
  local_70 = (char **)key._M_str;
  sVar9 = key._M_len;
  uVar7 = 0xffffffff00000000;
  if (__nptr == (char **)0x0) {
    uVar5 = 0;
    goto LAB_0011d75b;
  }
  pvVar2 = memchr(__s,0x2c,(size_t)__nptr);
  ppcVar3 = (char **)((long)pvVar2 - (long)__s);
  local_68 = sVar9;
  local_60 = __s;
  local_58 = __nptr;
  if (ppcVar3 == (char **)0xffffffffffffffff || pvVar2 == (void *)0x0) {
    piVar10 = (int *)0x171f8a;
    lVar8 = 0;
    ppcVar3 = __nptr;
LAB_0011d5f2:
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,__s,(char *)((long)ppcVar3 + (long)__s));
    __nptr = local_a8;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    uVar5 = strtol((char *)__nptr,(char **)&local_50,10);
    if ((char **)local_50._M_dataplus._M_p == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar4 != 0x22)) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,(ulong)(local_98 + 1));
      }
      uVar5 = uVar5 & 0xffffffff;
      goto LAB_0011d698;
    }
    std::__throw_out_of_range("stoi");
LAB_0011d793:
    std::__throw_invalid_argument("stoi");
  }
  else {
    piVar10 = (int *)((long)ppcVar3 + 1);
    if (__nptr <= ppcVar3) goto LAB_0011d7ab;
    lVar8 = (long)__nptr - (long)piVar10;
    piVar10 = (int *)((long)piVar10 + (long)__s);
    if (ppcVar3 != (char **)0x0) goto LAB_0011d5f2;
    uVar5 = 0;
LAB_0011d698:
    if (lVar8 == 0) {
      uVar7 = 0xffffffff00000000;
LAB_0011d75b:
      return (HalfRange)(uVar5 | uVar7);
    }
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,piVar10,(char *)(lVar8 + (long)piVar10));
    __nptr = local_a8;
    piVar10 = __errno_location();
    iVar1 = *piVar10;
    *piVar10 = 0;
    lVar8 = strtol((char *)__nptr,(char **)&local_50,10);
    if ((char **)local_50._M_dataplus._M_p == __nptr) goto LAB_0011d793;
    if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar10 != 0x22)) {
      if (*piVar10 == 0) {
        *piVar10 = iVar1;
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,(ulong)(local_98 + 1));
      }
      uVar7 = (lVar8 << 0x20) + 0x100000000;
      goto LAB_0011d75b;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0011d7ab:
  auVar11 = std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",piVar10,__nptr);
  if (auVar11._8_4_ == 1) {
    plVar6 = (long *)__cxa_begin_catch(auVar11._0_8_);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_88 = (**(code **)(*plVar6 + 0x10))(plVar6);
    local_a8 = local_70;
    local_a0 = local_68;
    local_98 = local_60;
    local_90 = local_58;
    fmt.size_ = 0xcdd;
    fmt.data_ = (char *)0x1d;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"Invalid key-value \"{}={}\": {}",fmt,args);
    std::invalid_argument::invalid_argument(this,(string *)&local_50);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _Unwind_Resume(auVar11._0_8_);
}

Assistant:

[[nodiscard]] inline SelectorRange::HalfRange parseHalfRange(std::string_view key, std::string_view str) {
    const auto indexComma = str.find(',');
    const auto strBegin = indexComma == std::string_view::npos ? str : str.substr(0, indexComma);
    const auto strEnd = indexComma == std::string_view::npos ? "" : str.substr(indexComma + 1);

    try {
        const auto begin = strBegin.empty() ? 0u : static_cast<uint32_t>(std::stoi(std::string(strBegin)));
        const auto end = strEnd.empty() ? RangeEnd : static_cast<uint32_t>(std::stoi(std::string(strEnd))) + 1u;
        return {begin, end};
    } catch (const std::exception& ex) {
        throw std::invalid_argument(fmt::format("Invalid key-value \"{}={}\": {}", key, str, ex.what()));
    }
}